

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

void __thiscall
crnlib::dxt_hc::determine_alpha_endpoint_clusters_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  tile_details *ptVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  uint16 uVar6;
  uint a;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ulong uVar7;
  
  uVar9 = CONCAT44(0,this->m_pTask_pool->m_num_threads + 1);
  uVar5 = (ulong)(this->m_tiles).m_size;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar9;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar5 * data;
  uVar9 = ((data + 1) * uVar5) / uVar9;
  if (SUB164(auVar4 / auVar3,0) < (uint)uVar9) {
    uVar5 = SUB168(auVar4 / auVar3,0) & 0xffffffff;
    do {
      if (((this->m_tiles).m_p[uVar5].pixels.m_size != 0) && (this->m_num_alpha_blocks != 0)) {
        uVar8 = 0;
        do {
          ptVar1 = (this->m_tiles).m_p;
          uVar7 = 0;
          uVar6 = 0;
          if ((ulong)*(uint *)((long)pData_ptr + 0xa0) != 0) {
            uVar10 = 0;
            fVar11 = 1e+37;
            do {
              fVar13 = *(float *)(*(long *)((long)pData_ptr + 0x98) + uVar10 * 8) -
                       ptVar1[uVar5].alpha_endpoints[uVar8].m_s[0];
              fVar12 = *(float *)(*(long *)((long)pData_ptr + 0x98) + 4 + uVar10 * 8) -
                       ptVar1[uVar5].alpha_endpoints[uVar8].m_s[1];
              fVar12 = fVar12 * fVar12 + fVar13 * fVar13;
              bVar2 = fVar12 < fVar11;
              if (bVar2) {
                uVar7 = uVar10 & 0xffffffff;
                fVar11 = fVar12;
              }
              uVar6 = (uint16)uVar7;
            } while ((!bVar2 || fVar12 != 0.0) &&
                    (uVar10 = uVar10 + 1, uVar10 < *(uint *)((long)pData_ptr + 0xa0)));
          }
          ptVar1[uVar5].cluster_indices[uVar8 + 1] = uVar6;
          uVar8 = uVar8 + 1;
        } while (uVar8 < this->m_num_alpha_blocks);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (uVar9 & 0xffffffff));
  }
  return;
}

Assistant:

void dxt_hc::determine_alpha_endpoint_clusters_task(uint64 data, void* pData_ptr) {
  tree_clusterizer<vec2F>* vq = (tree_clusterizer<vec2F>*)pData_ptr;
  const crnlib::vector<vec2F>& codebook = vq->get_codebook();
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  for (uint t = m_tiles.size() * data / num_tasks, tEnd = m_tiles.size() * (data + 1) / num_tasks; t < tEnd; t++) {
    if (m_tiles[t].pixels.size()) {
      for (uint a = 0; a < m_num_alpha_blocks; a++) {
        const vec2F& v = m_tiles[t].alpha_endpoints[a];
        float best_dist = math::cNearlyInfinite;
        uint best_index = 0;
        for (uint i = 0; i < codebook.size(); i++) {
          float dist = (codebook[i][0] - v[0]) * (codebook[i][0] - v[0]) + (codebook[i][1] - v[1]) * (codebook[i][1] - v[1]);
          if (dist < best_dist) {
            best_dist = dist;
            best_index = i;
            if (best_dist == 0.0f)
              break;
          }
        }
        m_tiles[t].cluster_indices[cAlpha0 + a] = best_index;
      }
    }
  }
}